

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O2

int __thiscall
bdHashSpace::search(bdHashSpace *this,bdNodeId *id,string *key,uint32_t maxAge,
                   list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries)

{
  int iVar1;
  iterator iVar2;
  string sStack_48;
  
  iVar2 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdHashSet>,_std::_Select1st<std::pair<const_bdNodeId,_bdHashSet>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
          ::find((_Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdHashSet>,_std::_Select1st<std::pair<const_bdNodeId,_bdHashSet>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->mHashTable)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&sStack_48,(string *)key);
    iVar1 = bdHashSet::search((bdHashSet *)&iVar2._M_node[1]._M_right,&sStack_48,maxAge,entries);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return iVar1;
}

Assistant:

int 	bdHashSpace::search(bdNodeId *id, std::string key, uint32_t maxAge, std::list<bdHashEntry> &entries) {
	std::map<bdNodeId, bdHashSet>::iterator it;
	it = mHashTable.find(*id);
	if (it == mHashTable.end()) 
	{
		/* no entry */
		return 1;
	}

	return it->second.search(key, maxAge, entries);
}